

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  FT_Memory memory;
  CFF_VarRegion *pCVar1;
  CFF_AxisCoords *pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  FT_UInt FVar8;
  FT_Int32 *pFVar9;
  long b_;
  FT_Long FVar10;
  FT_Fixed *__dest;
  int iVar11;
  long *plVar12;
  long a_;
  CFF_Blend pCVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  FT_Error error;
  FT_Error local_74;
  CFF_Blend local_70;
  FT_UInt local_68;
  FT_UInt local_64;
  ulong local_60;
  long *local_58;
  CFF_VarData *local_50;
  FT_Memory local_48;
  CFF_Font local_40;
  ulong local_38;
  
  local_74 = 0;
  if (lenNDV == 0 || NDV != (FT_Fixed *)0x0) {
    local_40 = blend->font;
    memory = local_40->memory;
    blend->builtBV = '\0';
    if (((lenNDV == 0) || ((local_40->vstore).axisCount == lenNDV)) &&
       (vsindex < (local_40->vstore).dataCount)) {
      local_50 = (local_40->vstore).varData;
      uVar14 = local_50[vsindex].regionIdxCount + 1;
      local_70 = blend;
      pFVar9 = (FT_Int32 *)
               ft_mem_qrealloc(memory,4,(ulong)blend->lenBV,(ulong)uVar14,blend->BV,&local_74);
      local_70->BV = pFVar9;
      if (local_74 != 0) {
        return local_74;
      }
      local_70->lenBV = uVar14;
      local_60 = (ulong)lenNDV;
      pCVar13 = local_70;
      local_68 = lenNDV;
      local_64 = vsindex;
      local_58 = NDV;
      local_48 = memory;
      if (uVar14 != 0) {
        local_50 = local_50 + vsindex;
        lVar7 = local_60 * 0x18;
        uVar15 = 0;
        local_38 = (ulong)uVar14;
        do {
          if (uVar15 == 0) {
            *pFVar9 = 0x10000;
          }
          else {
            uVar14 = local_50->regionIndices[uVar15 - 1];
            if ((local_40->vstore).regionCount <= uVar14) {
              return 3;
            }
            if (local_68 == 0) {
              pFVar9[uVar15] = 0;
            }
            else {
              pCVar1 = (local_40->vstore).varRegionList;
              pFVar9[uVar15] = 0x10000;
              lVar16 = 0;
              plVar12 = local_58;
              do {
                pCVar2 = pCVar1[uVar14].axisList;
                lVar3 = *(long *)((long)&pCVar2->startCoord + lVar16);
                lVar4 = *(long *)((long)&pCVar2->peakCoord + lVar16);
                iVar11 = 0x10000;
                if (lVar3 <= lVar4) {
                  lVar5 = *(long *)((long)&pCVar2->endCoord + lVar16);
                  b_ = lVar5 - lVar4;
                  if (lVar4 <= lVar5) {
                    if ((lVar4 != 0) && (-1 < lVar3 || lVar5 < 1)) {
                      lVar6 = *plVar12;
                      a_ = lVar5 - lVar6;
                      pCVar13 = local_70;
                      if (lVar5 < lVar6 || lVar6 < lVar3) {
                        iVar11 = 0;
                      }
                      else if (lVar6 != lVar4) {
                        if (lVar6 < lVar4) {
                          b_ = lVar4 - lVar3;
                          a_ = lVar6 - lVar3;
                        }
                        FVar10 = FT_DivFix(a_,b_);
                        iVar11 = (int)FVar10;
                        pCVar13 = local_70;
                      }
                    }
                  }
                }
                pFVar9 = pCVar13->BV;
                pFVar9[uVar15] =
                     (FT_Int32)
                     ((ulong)((long)iVar11 * (long)pFVar9[uVar15] +
                              ((long)iVar11 * (long)pFVar9[uVar15] >> 0x3f) + 0x8000) >> 0x10);
                lVar16 = lVar16 + 0x18;
                plVar12 = plVar12 + 1;
              } while (lVar7 != lVar16);
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_38);
      }
      uVar15 = local_60;
      FVar8 = local_68;
      pCVar13->lastVsindex = local_64;
      if (local_68 != 0) {
        __dest = (FT_Fixed *)
                 ft_mem_qrealloc(local_48,8,(ulong)pCVar13->lenNDV,local_60,pCVar13->lastNDV,
                                 &local_74);
        local_70->lastNDV = __dest;
        if (local_74 != 0) {
          return local_74;
        }
        memcpy(__dest,local_58,uVar15 << 3);
        pCVar13 = local_70;
      }
      pCVar13->lenNDV = FVar8;
      pCVar13->builtBV = '\x01';
      return local_74;
    }
  }
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    /* protect against malformed fonts */
    if ( !( lenNDV == 0 || NDV ) )
    {
      FT_TRACE4(( " cff_blend_build_vector:"
                  " Malformed Normalize Design Vector data\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_QRENEW_ARRAY( blend->BV, blend->lenBV, len ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n", len ));
        FT_TRACE4(( "   [ %f ", blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_QRENEW_ARRAY( blend->lastNDV, blend->lenNDV, lenNDV ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }